

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall helics::apps::Recorder::saveFile(Recorder *this,string *filename)

{
  long lVar1;
  int iVar2;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  size_type sVar3;
  
  if (filename->_M_string_length == 0) {
LAB_00181c78:
    __pos = 0xffffffffffffffff;
  }
  else {
    sVar3 = filename->_M_string_length;
    do {
      __pos = sVar3 - 1;
      if (sVar3 == 0) goto LAB_00181c78;
      lVar1 = sVar3 - 1;
      sVar3 = __pos;
    } while ((filename->_M_dataplus)._M_p[lVar1] != '.');
  }
  if (__pos == 0xffffffffffffffff) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_30,filename,__pos,0xffffffffffffffff);
  }
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(&local_30,".json");
  if ((iVar2 == 0) ||
     (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_30,".JSON"), iVar2 == 0)) {
    writeJsonFile(this,filename);
  }
  else {
    writeTextFile(this,filename);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Recorder::saveFile(const std::string& filename)
{
    auto lastP = filename.find_last_of('.');
    auto ext = (lastP != std::string::npos) ? filename.substr(lastP) : std::string{};
    if ((ext == ".json") || (ext == ".JSON")) {
        writeJsonFile(filename);
    } else {
        writeTextFile(filename);
    }
}